

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_filter.cpp
# Opt level: O2

string * __thiscall
duckdb::DynamicFilter::ToString
          (string *__return_storage_ptr__,DynamicFilter *this,string *column_name)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if ((this->filter_data).internal.
      super___shared_ptr<duckdb::DynamicFilterData,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    ::std::operator+(&local_30,"Empty Dynamic Filter (",column_name);
    ::std::operator+(__return_storage_ptr__,&local_30,")");
  }
  else {
    ::std::operator+(&local_30,"Dynamic Filter (",column_name);
    ::std::operator+(__return_storage_ptr__,&local_30,")");
  }
  ::std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

string DynamicFilter::ToString(const string &column_name) const {
	if (filter_data) {
		return "Dynamic Filter (" + column_name + ")";
	} else {
		return "Empty Dynamic Filter (" + column_name + ")";
	}
}